

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_service.cpp
# Opt level: O0

void __thiscall
booster::aio::event_loop_impl::io_event_canceler::operator()(io_event_canceler *this)

{
  bool bVar1;
  pointer this_00;
  uint *in_RDI;
  error_code e;
  io_data *cont;
  lock_guard l;
  undefined4 in_stack_ffffffffffffff18;
  native_type in_stack_ffffffffffffff1c;
  unique_lock<std::recursive_mutex> *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  completion_handler *in_stack_ffffffffffffff30;
  error_code local_58;
  error_code local_48 [2];
  io_data *local_20;
  
  std::unique_lock<std::recursive_mutex>::unique_lock
            (in_stack_ffffffffffffff20,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  local_20 = socket_map<booster::aio::event_loop_impl::io_data>::operator[]
                       ((socket_map<booster::aio::event_loop_impl::io_data> *)
                        in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  local_20->current_event = 0;
  std::error_code::error_code((error_code *)in_stack_ffffffffffffff20);
  this_00 = std::unique_ptr<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>::
            operator->((unique_ptr<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>
                        *)0x20b167);
  reactor::remove(this_00,(char *)(ulong)*in_RDI);
  std::error_code::error_code(&local_58,1,aio_error_cat);
  local_48[0]._M_value = local_58._M_value;
  local_48[0]._4_4_ = local_58._4_4_;
  local_48[0]._M_cat = local_58._M_cat;
  bVar1 = callback::operator_cast_to_bool((callback<void_(const_std::error_code_&)> *)0x20b1b7);
  if (bVar1) {
    in_stack_ffffffffffffff30 = (completion_handler *)(*(long *)(in_RDI + 2) + 0x58);
    completion_handler::completion_handler
              (in_stack_ffffffffffffff30,
               (event_handler *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               (error_code *)in_stack_ffffffffffffff20);
    std::
    deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
    ::push_back((deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                 *)in_stack_ffffffffffffff20,
                (value_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    completion_handler::~completion_handler((completion_handler *)0x20b217);
  }
  bVar1 = callback::operator_cast_to_bool((callback<void_(const_std::error_code_&)> *)0x20b266);
  if (bVar1) {
    in_stack_ffffffffffffff20 = (unique_lock<std::recursive_mutex> *)(*(long *)(in_RDI + 2) + 0x58);
    completion_handler::completion_handler
              (in_stack_ffffffffffffff30,(event_handler *)CONCAT17(bVar1,in_stack_ffffffffffffff28),
               (error_code *)in_stack_ffffffffffffff20);
    std::
    deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
    ::push_back((deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                 *)in_stack_ffffffffffffff20,
                (value_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    completion_handler::~completion_handler((completion_handler *)0x20b2c3);
  }
  socket_map<booster::aio::event_loop_impl::io_data>::erase
            ((socket_map<booster::aio::event_loop_impl::io_data> *)(*(long *)(in_RDI + 2) + 0x40),
             *in_RDI);
  std::unique_lock<std::recursive_mutex>::~unique_lock(in_stack_ffffffffffffff20);
  return;
}

Assistant:

void operator()() const
		{
			lock_guard l(self_->data_mutex_);
			
			io_data &cont=self_->map_[fd];
			cont.current_event = 0;
			system::error_code e;
			self_->reactor_->remove(fd,e);
			e = system::error_code(aio_error::canceled,aio_error_cat);
			// Maybe it is closed
			if(cont.readable)
				self_->dispatch_queue_.push_back(completion_handler(cont.readable,e));
			if(cont.writeable)
				self_->dispatch_queue_.push_back(completion_handler(cont.writeable,e));
			self_->map_.erase(fd);
		}